

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int uv_udp_set_membership
              (uv_udp_t *handle,char *multicast_addr,char *interface_addr,uv_membership membership)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  in_addr_t local_20;
  in_addr_t local_1c;
  
  if (interface_addr == (char *)0x0) {
    local_1c = 0;
  }
  else {
    local_1c = inet_addr(interface_addr);
  }
  local_20 = inet_addr(multicast_addr);
  if (membership == UV_JOIN_GROUP) {
    iVar1 = 0x23;
  }
  else {
    if (membership != UV_LEAVE_GROUP) {
      return -0x16;
    }
    iVar1 = 0x24;
  }
  iVar3 = 0;
  iVar1 = setsockopt((handle->io_watcher).fd,0,iVar1,&local_20,8);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    iVar3 = -*piVar2;
  }
  return iVar3;
}

Assistant:

int uv_udp_set_membership(uv_udp_t* handle,
                          const char* multicast_addr,
                          const char* interface_addr,
                          uv_membership membership) {
  struct ip_mreq mreq;
  int optname;

  memset(&mreq, 0, sizeof mreq);

  if (interface_addr) {
    mreq.imr_interface.s_addr = inet_addr(interface_addr);
  } else {
    mreq.imr_interface.s_addr = htonl(INADDR_ANY);
  }

  mreq.imr_multiaddr.s_addr = inet_addr(multicast_addr);

  switch (membership) {
  case UV_JOIN_GROUP:
    optname = IP_ADD_MEMBERSHIP;
    break;
  case UV_LEAVE_GROUP:
    optname = IP_DROP_MEMBERSHIP;
    break;
  default:
    return -EINVAL;
  }

  if (setsockopt(handle->io_watcher.fd,
                 IPPROTO_IP,
                 optname,
                 &mreq,
                 sizeof(mreq))) {
    return -errno;
  }

  return 0;
}